

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__horizontal_gather_7_channels_with_4_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  __m128 cs;
  __m128 c;
  __m128 tot3;
  __m128 tot2;
  __m128 tot1;
  __m128 tot0;
  float *hc;
  float *decode;
  float *output;
  float *output_end;
  float *pfStack_2f8;
  int coefficient_width_local;
  float *horizontal_coefficients_local;
  stbir__contributors *horizontal_contributors_local;
  float *decode_buffer_local;
  uint output_sub_size_local;
  float *output_buffer_local;
  float fStack_1fc;
  float fStack_1f0;
  float fStack_1e4;
  float local_1d8;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  
  decode = output_buffer;
  pfStack_2f8 = horizontal_coefficients;
  horizontal_coefficients_local = (float *)horizontal_contributors;
  do {
    pfVar1 = decode_buffer + (int)*horizontal_coefficients_local * 7;
    local_1d8 = (float)*(undefined8 *)pfStack_2f8;
    local_e8 = (float)*(undefined8 *)pfVar1;
    fStack_e4 = (float)((ulong)*(undefined8 *)pfVar1 >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfVar1 + 2);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfVar1 + 2) >> 0x20);
    local_108 = (float)*(undefined8 *)(pfVar1 + 3);
    fStack_104 = (float)((ulong)*(undefined8 *)(pfVar1 + 3) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfVar1 + 5);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfVar1 + 5) >> 0x20);
    fStack_1e4 = (float)((ulong)*(undefined8 *)pfStack_2f8 >> 0x20);
    local_128 = (float)*(undefined8 *)(pfVar1 + 7);
    fStack_124 = (float)((ulong)*(undefined8 *)(pfVar1 + 7) >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfVar1 + 9);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfVar1 + 9) >> 0x20);
    local_148 = (float)*(undefined8 *)(pfVar1 + 10);
    fStack_144 = (float)((ulong)*(undefined8 *)(pfVar1 + 10) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfVar1 + 0xc);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfVar1 + 0xc) >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(pfStack_2f8 + 2);
    local_168 = (float)*(undefined8 *)(pfVar1 + 0xe);
    fStack_164 = (float)((ulong)*(undefined8 *)(pfVar1 + 0xe) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfVar1 + 0x10);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x10) >> 0x20);
    local_188 = (float)*(undefined8 *)(pfVar1 + 0x11);
    fStack_184 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x11) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfVar1 + 0x13);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x13) >> 0x20);
    fStack_1fc = (float)((ulong)*(undefined8 *)(pfStack_2f8 + 2) >> 0x20);
    local_1a8 = (float)*(undefined8 *)(pfVar1 + 0x15);
    fStack_1a4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x15) >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfVar1 + 0x17);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfVar1 + 0x17) >> 0x20);
    local_1c8 = (float)*(undefined8 *)(pfVar1 + 0x18);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfVar1 + 0x18) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfVar1 + 0x1a);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfVar1 + 0x1a) >> 0x20);
    *(ulong *)(decode + 3) =
         CONCAT44(local_1d8 * fStack_104 + fStack_1f0 * fStack_184 +
                  fStack_1e4 * fStack_144 + fStack_1fc * fStack_1c4,
                  local_1d8 * local_108 + fStack_1f0 * local_188 +
                  fStack_1e4 * local_148 + fStack_1fc * local_1c8);
    *(ulong *)(decode + 5) =
         CONCAT44(local_1d8 * fStack_fc + fStack_1f0 * fStack_17c +
                  fStack_1e4 * fStack_13c + fStack_1fc * fStack_1bc,
                  local_1d8 * fStack_100 + fStack_1f0 * fStack_180 +
                  fStack_1e4 * fStack_140 + fStack_1fc * fStack_1c0);
    *(ulong *)decode =
         CONCAT44(local_1d8 * fStack_e4 + fStack_1f0 * fStack_164 +
                  fStack_1e4 * fStack_124 + fStack_1fc * fStack_1a4,
                  local_1d8 * local_e8 + fStack_1f0 * local_168 +
                  fStack_1e4 * local_128 + fStack_1fc * local_1a8);
    *(ulong *)(decode + 2) =
         CONCAT44(local_1d8 * fStack_dc + fStack_1f0 * fStack_15c +
                  fStack_1e4 * fStack_11c + fStack_1fc * fStack_19c,
                  local_1d8 * fStack_e0 + fStack_1f0 * fStack_160 +
                  fStack_1e4 * fStack_120 + fStack_1fc * fStack_1a0);
    pfStack_2f8 = pfStack_2f8 + coefficient_width;
    horizontal_coefficients_local = horizontal_coefficients_local + 2;
    decode = decode + 7;
  } while (decode < output_buffer + output_sub_size * 7);
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_4_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__store_output();
  } while ( output < output_end );
}